

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_>::alloc
          (array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *this,int new_len
          )

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  CRule *pCVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  CRule *pCVar9;
  long lVar10;
  ulong uVar11;
  
  this->list_size = new_len;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)new_len;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x28),8) == 0) {
    uVar11 = SUB168(auVar4 * ZEXT816(0x28),0);
  }
  pCVar9 = (CRule *)operator_new__(uVar11);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  if (0 < new_len) {
    pCVar3 = this->list;
    lVar10 = 0;
    do {
      *(undefined8 *)((long)&pCVar9->m_HFlip + lVar10) =
           *(undefined8 *)((long)&pCVar3->m_HFlip + lVar10);
      puVar1 = (undefined8 *)((long)&(pCVar3->m_Rect).field_0 + lVar10);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pCVar3->m_RelativePos).field_0 + lVar10);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pCVar9->m_RelativePos).field_0 + lVar10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      puVar1 = (undefined8 *)((long)&(pCVar9->m_Rect).field_0 + lVar10);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      lVar10 = lVar10 + 0x28;
    } while ((ulong)(uint)new_len * 0x28 != lVar10);
  }
  if (this->list != (CRule *)0x0) {
    operator_delete__(this->list);
  }
  iVar8 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar8 = this->num_elements;
  }
  this->num_elements = iVar8;
  this->list = pCVar9;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}